

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O2

void secp256k1_testrand_flip(uchar *b,size_t len)

{
  uint32_t uVar1;
  uint64_t uVar2;
  
  uVar2 = secp256k1_testrand64();
  uVar1 = secp256k1_testrand_int((uint32_t)len);
  b[uVar1] = b[uVar1] ^ '\x01' << (byte)(uVar2 >> 0x3d);
  return;
}

Assistant:

static void secp256k1_testrand_flip(unsigned char *b, size_t len) {
    b[secp256k1_testrand_int(len)] ^= (1 << secp256k1_testrand_bits(3));
}